

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Cpu.cpp
# Opt level: O0

void __thiscall Sap_Cpu::reset(Sap_Cpu *this,void *new_mem)

{
  undefined8 in_RSI;
  undefined2 *in_RDI;
  
  *(undefined2 **)(in_RDI + 4) = in_RDI + 8;
  *(undefined8 *)(in_RDI + 0x10) = in_RSI;
  *(undefined1 *)((long)in_RDI + 5) = 4;
  *(undefined1 *)(in_RDI + 3) = 0xff;
  *in_RDI = 0;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 3) = 0;
  *(undefined1 *)(in_RDI + 2) = 0;
  *(undefined4 *)(in_RDI + 10) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0x40000000;
  *(undefined4 *)(in_RDI + 0xe) = 0x40000000;
  blargg_verify_byte_order();
  return;
}

Assistant:

void Sap_Cpu::reset( void* new_mem )
{
	check( state == &state_ );
	state = &state_;
	mem = (uint8_t*) new_mem;
	r.status = st_i;
	r.sp = 0xFF;
	r.pc = 0;
	r.a  = 0;
	r.x  = 0;
	r.y  = 0;
	state_.time = 0;
	state_.base = 0;
	irq_time_ = future_sap_time;
	end_time_ = future_sap_time;
	
	blargg_verify_byte_order();
}